

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

Vec2 __thiscall tcu::clampLodBounds(tcu *this,Vec2 *lodBounds,Vec2 *lodMinMax,LodPrecision *prec)

{
  Vec2 VVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float x;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  float b;
  float a;
  float lodErr;
  LodPrecision *prec_local;
  Vec2 *lodMinMax_local;
  Vec2 *lodBounds_local;
  
  fVar2 = TexVerifierUtil::computeFixedPointError(prec->lodBits);
  fVar3 = Vector<float,_2>::x(lodMinMax);
  fVar4 = Vector<float,_2>::y(lodMinMax);
  fVar5 = Vector<float,_2>::x(lodBounds);
  fVar5 = de::clamp<float>(fVar5,fVar3 - fVar2,fVar4 - fVar2);
  x = Vector<float,_2>::y(lodBounds);
  fVar2 = de::clamp<float>(x,fVar3 + fVar2,fVar4 + fVar2);
  Vector<float,_2>::Vector((Vector<float,_2> *)this,fVar5,fVar2);
  VVar1.m_data[1] = extraout_XMM0_Db;
  VVar1.m_data[0] = extraout_XMM0_Da;
  return (Vec2)VVar1.m_data;
}

Assistant:

Vec2 clampLodBounds (const Vec2& lodBounds, const Vec2& lodMinMax, const LodPrecision& prec)
{
	const float lodErr	= computeFixedPointError(prec.lodBits);
	const float	a		= lodMinMax.x();
	const float	b		= lodMinMax.y();
	return Vec2(de::clamp(lodBounds.x(), a-lodErr, b-lodErr), de::clamp(lodBounds.y(), a+lodErr, b+lodErr));
}